

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uncertain_measurements.cpp
# Opt level: O0

void __thiscall uncertainOps_unaryOps_Test::TestBody(uncertainOps_unaryOps_Test *this)

{
  unit *this_00;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_100;
  Message local_f8;
  unit local_f0;
  unit local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_3;
  Message local_c8;
  double local_c0;
  double local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_2;
  Message local_98;
  double local_90;
  double local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [3];
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  uncertain_measurement y;
  uncertain_measurement z;
  uncertain_measurement x;
  uncertainOps_unaryOps_Test *this_local;
  
  this_00 = &z.units_;
  units::uncertain_measurement::uncertain_measurement
            ((uncertain_measurement *)this_00,2.0,0.2,(unit *)&units::cm);
  join_0x00000000_0x00001200_ =
       units::uncertain_measurement::operator-((uncertain_measurement *)this_00);
  join_0x00000000_0x00001200_ =
       units::uncertain_measurement::operator+((uncertain_measurement *)this_00);
  testing::internal::EqHelper::
  Compare<units::uncertain_measurement,_units::uncertain_measurement,_nullptr>
            ((EqHelper *)local_50,"y","x",(uncertain_measurement *)&gtest_ar.message_,
             (uncertain_measurement *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_uncertain_measurements.cpp"
               ,0x7c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  local_88 = units::uncertain_measurement::value((uncertain_measurement *)&y.units_);
  local_90 = units::uncertain_measurement::value((uncertain_measurement *)&z.units_);
  local_90 = -local_90;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_80,"z.value()","-x.value()",&local_88,&local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_uncertain_measurements.cpp"
               ,0x7d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_b8 = units::uncertain_measurement::uncertainty((uncertain_measurement *)&y.units_);
  local_c0 = units::uncertain_measurement::uncertainty((uncertain_measurement *)&z.units_);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_b0,"z.uncertainty()","x.uncertainty()",&local_b8,&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_uncertain_measurements.cpp"
               ,0x7e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_e8 = units::uncertain_measurement::units((uncertain_measurement *)&y.units_);
  local_f0 = units::uncertain_measurement::units((uncertain_measurement *)&z.units_);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_e0,"z.units()","x.units()",&local_e8,&local_f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_uncertain_measurements.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  return;
}

Assistant:

TEST(uncertainOps, unaryOps)
{
    uncertain_measurement x(2.0, 0.2, cm);

    auto z = -x;
    auto y = +x;
    EXPECT_EQ(y, x);
    EXPECT_EQ(z.value(), -x.value());
    EXPECT_EQ(z.uncertainty(), x.uncertainty());
    EXPECT_EQ(z.units(), x.units());
}